

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSimpleConfigCase.cpp
# Opt level: O0

int __thiscall deqp::egl::SimpleConfigCase::init(SimpleConfigCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *__return_storage_ptr__;
  ulong uVar1;
  bool bVar2;
  EGLint EVar3;
  int extraout_EAX;
  Library *egl_00;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar4;
  size_type sVar5;
  reference ppvVar6;
  reference pvVar7;
  TestLog *this_00;
  MessageBuilder *pMVar8;
  NotSupportedError *this_01;
  iterator iVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_208;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_200;
  Array<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_> local_1f8;
  MessageBuilder local_1e8;
  ulong local_68;
  size_t ndx;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> configIds;
  Library *egl;
  SimpleConfigCase *this_local;
  
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar4 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  this->m_display = pvVar4;
  __return_storage_ptr__ =
       &configIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  eglu::chooseConfigs((vector<void_*,_std::allocator<void_*>_> *)__return_storage_ptr__,egl_00,
                      this->m_display,&this->m_filters);
  std::vector<void_*,_std::allocator<void_*>_>::operator=
            (&this->m_configs,(vector<void_*,_std::allocator<void_*>_> *)__return_storage_ptr__);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)__return_storage_ptr__);
  sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_configs);
  std::allocator<int>::allocator(&local_49);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,sVar5,&local_49);
  std::allocator<int>::~allocator(&local_49);
  local_68 = 0;
  while( true ) {
    uVar1 = local_68;
    sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_configs);
    if (sVar5 <= uVar1) break;
    pvVar4 = this->m_display;
    ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[](&this->m_configs,local_68);
    EVar3 = eglu::getConfigID(egl_00,pvVar4,*ppvVar6);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,local_68);
    *pvVar7 = EVar3;
    local_68 = local_68 + 1;
  }
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_1e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [21])"Compatible configs: ");
  local_200._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_48);
  local_208._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_48);
  local_1f8 = tcu::
              formatArray<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                        (&local_200,&local_208);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1f8);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  bVar2 = std::vector<void_*,_std::allocator<void_*>_>::empty(&this->m_configs);
  if (!bVar2) {
    iVar9 = std::vector<void_*,_std::allocator<void_*>_>::begin(&this->m_configs);
    (this->m_configIter)._M_current = iVar9._M_current;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return extraout_EAX;
  }
  (*egl_00->_vptr_Library[0x34])(egl_00,this->m_display);
  this->m_display = (EGLDisplay)0x0;
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"No compatible configs found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSimpleConfigCase.cpp"
             ,0x4e);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void SimpleConfigCase::init (void)
{
	const Library&		egl		= m_eglTestCtx.getLibrary();

	DE_ASSERT(m_display == EGL_NO_DISPLAY && m_configs.empty());

	m_display	= getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_configs	= chooseConfigs(egl, m_display, m_filters);

	// Log matching configs.
	{
		vector<EGLint> configIds(m_configs.size());

		for (size_t ndx = 0; ndx < m_configs.size(); ndx++)
			configIds[ndx] = getConfigID(egl, m_display, m_configs[ndx]);

		m_testCtx.getLog() << TestLog::Message << "Compatible configs: " << tcu::formatArray(configIds.begin(), configIds.end()) << TestLog::EndMessage;
	}

	if (m_configs.empty())
	{
		egl.terminate(m_display);
		m_display = EGL_NO_DISPLAY;
		TCU_THROW(NotSupportedError, "No compatible configs found");
	}

	// Init config iter
	m_configIter = m_configs.begin();

	// Init test case result to Pass
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}